

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printPolicyPureVector.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  long lVar2;
  MADPParser parser;
  PlanningUnitMADPDiscreteParameters params;
  string dpomdpFile;
  PolicyPureVector p;
  NullPlanner np;
  DecPOMDPDiscrete decpomdp;
  DecPOMDPDiscrete local_602;
  PlanningUnitMADPDiscreteParameters local_601 [6];
  undefined1 local_5fb;
  long *local_5f8 [2];
  long local_5e8 [2];
  long *local_5d8 [2];
  long local_5c8 [8];
  long *local_588 [2];
  long local_578 [3];
  Interface_ProblemToPolicyDiscretePure local_560 [784];
  long local_250 [70];
  
  if (argc == 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_588,argv[1],(allocator<char> *)local_250);
    directories::MADPGetProblemFilename((string *)local_5f8);
    if (local_588[0] != local_578) {
      operator_delete(local_588[0],local_578[0] + 1);
    }
    lVar2 = strtol(argv[2],(char **)0x0,10);
    strtoull(argv[3],(char **)0x0,10);
    local_588[0] = local_578;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_588,"");
    local_5d8[0] = local_5c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_5d8,"");
    DecPOMDPDiscrete::DecPOMDPDiscrete
              ((DecPOMDPDiscrete *)local_250,(string *)local_588,(string *)local_5d8,
               (string *)local_5f8);
    if (local_5d8[0] != local_5c8) {
      operator_delete(local_5d8[0],local_5c8[0] + 1);
    }
    if (local_588[0] != local_578) {
      operator_delete(local_588[0],local_578[0] + 1);
    }
    MADPParser::Parse(&local_602);
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_601);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_601,0));
    local_5fb = 0;
    NullPlanner::NullPlanner
              ((NullPlanner *)local_588,(long)(int)lVar2,
               (DecPOMDPDiscreteInterface *)((long)local_250 + *(long *)(local_250[0] + -0x50)),
               local_601);
    PolicyPureVector::PolicyPureVector((PolicyPureVector *)local_5d8,local_560,0,TYPE_INDEX,999999);
    PolicyPureVector::SetIndex((ulonglong)local_5d8);
    Policy::Print((Policy *)local_5d8);
    PolicyPureVector::~PolicyPureVector((PolicyPureVector *)local_5d8);
    PlanningUnitMADPDiscrete::~PlanningUnitMADPDiscrete((PlanningUnitMADPDiscrete *)local_588);
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_601);
    DecPOMDPDiscrete::~DecPOMDPDiscrete((DecPOMDPDiscrete *)local_250);
    if (local_5f8[0] != local_5e8) {
      operator_delete(local_5f8[0],local_5e8[0] + 1);
    }
    iVar1 = 0;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Use as follows: printPolicyPureVector ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"<problem> <horizon> <index>",0x1b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x58);
    std::ostream::put(-0x58);
    std::ostream::flush();
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int main(int argc, char **argv)
{
    if(argc!=4)
    {
        cout << "Use as follows: printPolicyPureVector "
             << "<problem> <horizon> <index>" << endl;
        return(1);
    }

    // parse arguments
    string dpomdpFile=directories::MADPGetProblemFilename(argv[1]);
    int h=strtol(argv[2],0,10);
#if USE_ARBITRARY_PRECISION_INDEX
    LIndex index=*argv[3];
#else
    LIndex index=strtoull(argv[3],0,10);
#endif
    try {

    DecPOMDPDiscrete decpomdp("","",dpomdpFile);
    MADPParser parser(&decpomdp);
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    params.SetComputeJointBeliefs(false);
    NullPlanner np(h, &decpomdp, &params);
    PolicyPureVector p(&np,0, PolicyGlobals::TYPE_INDEX);
    p.SetIndex(index);

    p.Print();

    }
    catch(E& e){ e.Print(); }

    return(0);
}